

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

bool __thiscall sqlite::Connection::Stmt::step(Stmt *this)

{
  int iVar1;
  sqlite3 *db;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar2;
  undefined8 *in_RDI;
  int status;
  char *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 uVar3;
  allocator in_stack_ffffffffffffff77;
  string *in_stack_ffffffffffffff78;
  Logic_error *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  bool local_1;
  
  iVar1 = sqlite3_step(*in_RDI);
  if (iVar1 == 100) {
    local_1 = true;
  }
  else {
    if (iVar1 != 0x65) {
      uVar3 = 1;
      db = (sqlite3 *)__cxa_allocate_exception(0x48);
      s_abi_cxx11_(in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              sqlite3_errmsg(in_RDI[1]);
      std::operator+(__lhs,in_stack_ffffffffffffff50);
      pcVar2 = (char *)sqlite3_sql(*in_RDI);
      iVar1 = (int)((ulong)in_RDI >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff78,pcVar2,(allocator *)&stack0xffffffffffffff77);
      Logic_error::Logic_error
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 (string *)
                 CONCAT17(in_stack_ffffffffffffff77,CONCAT16(uVar3,in_stack_ffffffffffffff70)),iVar1
                 ,db);
      __cxa_throw(db,&Logic_error::typeinfo,Logic_error::~Logic_error);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Connection::Stmt::step()
    {
        int status = sqlite3_step(stmt_);
        if(status == SQLITE_ROW)
        {
            return true;
        }
        else if(status == SQLITE_DONE)
        {
            return false;
        }
        else
        {
            throw Logic_error("Error evaluating SQL: "s +
                sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }